

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkGraphicsPipelineCreateInfo *pipe,SubpassMeta *subpass_meta,
               MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,Value *out_value)

{
  VkPipelineColorBlendStateCreateInfo *pVVar1;
  bool bVar2;
  unsigned_long uVar3;
  VkPipelineColorBlendAttachmentState *pVVar4;
  GlobalStateInfo GVar5;
  VkPipelineColorBlendAttachmentState *local_8b8;
  float local_8b0;
  byte local_8a9;
  GenericStringRef<char> local_8a8;
  undefined1 local_898 [8];
  Value stages;
  GenericStringRef<char> local_878;
  GenericStringRef<char> local_868;
  undefined1 local_858 [8];
  Value back;
  Value front;
  anon_class_8_1_a7a39255 serialize_stencil;
  GenericStringRef<char> local_820;
  GenericStringRef<char> local_810;
  GenericStringRef<char> local_800;
  GenericStringRef<char> local_7f0;
  GenericStringRef<char> local_7e0;
  GenericStringRef<char> local_7d0;
  GenericStringRef<char> local_7c0;
  undefined1 local_7b0 [8];
  Value ds;
  GenericStringRef<char> local_790;
  GenericStringRef<char> local_780;
  GenericStringRef<char> local_770;
  GenericStringRef<char> local_760;
  GenericStringRef<char> local_750;
  undefined1 local_740 [8];
  Value scissor;
  undefined1 local_728 [4];
  uint32_t i_6;
  Value scissors;
  GenericStringRef<char> local_708;
  GenericStringRef<char> local_6f8;
  GenericStringRef<char> local_6e8;
  GenericStringRef<char> local_6d8;
  GenericStringRef<char> local_6c8;
  GenericStringRef<char> local_6b8;
  undefined1 local_6a8 [8];
  Value viewport;
  undefined1 local_690 [4];
  uint32_t i_5;
  Value viewports;
  GenericStringRef<char> local_670;
  GenericStringRef<char> local_660;
  undefined1 local_650 [8];
  Value vp;
  GenericStringRef<char> local_630;
  GenericStringRef<char> local_620;
  GenericStringRef<char> local_610;
  GenericStringRef<char> local_600;
  GenericStringRef<char> local_5f0;
  GenericStringRef<char> local_5e0;
  GenericStringRef<char> local_5d0;
  GenericStringRef<char> local_5c0;
  GenericStringRef<char> local_5b0;
  undefined1 local_5a0 [8];
  Value att;
  VkPipelineColorBlendAttachmentState *a_2;
  undefined1 local_580 [4];
  uint32_t i_4;
  Value attachments;
  float *c;
  float *__end3;
  float *__begin3;
  float (*__range3) [4];
  Value blend_constants;
  VkPipelineColorBlendAttachmentState blank_attachment;
  VkPipelineColorBlendAttachmentState *a_1;
  uint32_t i_3;
  bool dynamic_attachments;
  bool need_blend_constants;
  GenericStringRef<char> local_4f0;
  GenericStringRef<char> local_4e0;
  undefined1 local_4d0 [8];
  Value cb;
  GenericStringRef<char> local_4b0;
  GenericStringRef<char> local_4a0;
  GenericStringRef<char> local_490;
  undefined1 local_480 [8];
  Value ia;
  GenericStringRef<char> local_460;
  GenericStringRef<char> local_450;
  GenericStringRef<char> local_440;
  GenericStringRef<char> local_430;
  GenericStringRef<char> local_420;
  GenericStringRef<char> local_410;
  GenericStringRef<char> local_400;
  GenericStringRef<char> local_3f0;
  GenericStringRef<char> local_3e0;
  GenericStringRef<char> local_3d0;
  GenericStringRef<char> local_3c0;
  undefined1 local_3b0 [8];
  Value rs;
  GenericStringRef<char> local_390;
  GenericStringRef<char> local_380;
  GenericStringRef<char> local_370;
  GenericStringRef<char> local_360;
  GenericStringRef<char> local_350;
  undefined1 local_340 [8];
  Value binding;
  VkVertexInputBindingDescription *b;
  undefined1 local_320 [4];
  uint32_t i_2;
  GenericStringRef<char> local_310;
  GenericStringRef<char> local_300;
  GenericStringRef<char> local_2f0;
  undefined1 local_2e0 [8];
  Value attrib;
  VkVertexInputAttributeDescription *a;
  undefined1 local_2c0 [4];
  uint32_t i_1;
  undefined1 local_2b0 [8];
  Value bindings;
  Value attribs;
  Value vi;
  GenericStringRef<char> local_270;
  uint local_260;
  uint local_25c;
  uint32_t i;
  uint32_t entries;
  Value sm;
  GenericStringRef<char> local_238;
  GenericStringRef<char> local_228;
  GenericStringRef<char> local_218;
  GenericStringRef<char> local_208;
  GenericStringRef<char> local_1f8;
  undefined1 local_1e8 [8];
  Value ms;
  undefined1 local_1c8 [8];
  Value dyn;
  GenericStringRef<char> local_1a0;
  GenericStringRef<char> local_190;
  undefined1 local_180 [8];
  Value tess;
  GlobalStateInfo global_info;
  undefined1 local_110 [8];
  DynamicStateInfo dynamic_info;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_c0;
  GenericStringRef<char> local_b0;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_a0;
  GenericStringRef<char> local_90;
  GenericStringRef<char> local_80;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_70;
  GenericStringRef<char> local_60;
  GenericStringRef<char> local_50;
  undefined1 local_40 [8];
  Value p;
  Value *out_value_local;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc_local;
  SubpassMeta *subpass_meta_local;
  VkGraphicsPipelineCreateInfo *pipe_local;
  
  p.data_.o.members = (Member *)out_value;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_40,kObjectType);
  rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_50,(char (*) [6])"flags");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_40,&local_50,pipe->flags,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<19u>
            (&local_60,(char (*) [19])"basePipelineHandle");
  uVar3 = api_object_cast<unsigned_long,VkPipeline_T*>(pipe->basePipelineHandle);
  uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ((Fossilize *)&local_70,uVar3,alloc);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_40,&local_60,&local_70,alloc);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(&local_70);
  rapidjson::GenericStringRef<char>::GenericStringRef<18u>
            (&local_80,(char (*) [18])"basePipelineIndex");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<int>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_40,&local_80,pipe->basePipelineIndex,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<7u>(&local_90,(char (*) [7])0x1dfc22);
  uVar3 = api_object_cast<unsigned_long,VkPipelineLayout_T*>(pipe->layout);
  uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ((Fossilize *)&local_a0,uVar3,alloc);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_40,&local_90,&local_a0,alloc);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(&local_a0);
  rapidjson::GenericStringRef<char>::GenericStringRef<11u>(&local_b0,(char (*) [11])"renderPass");
  uVar3 = api_object_cast<unsigned_long,VkRenderPass_T*>(pipe->renderPass);
  uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ((Fossilize *)&local_c0,uVar3,alloc);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_40,&local_b0,&local_c0,alloc);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(&local_c0);
  rapidjson::GenericStringRef<char>::GenericStringRef<8u>
            ((GenericStringRef<char> *)&dynamic_info.coverage_to_color_location,
             (char (*) [8])"subpass");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_40,(StringRefType *)&dynamic_info.coverage_to_color_location,pipe->subpass,
             alloc);
  memset(local_110,0,0x40);
  if (pipe->pDynamicState != (VkPipelineDynamicStateCreateInfo *)0x0) {
    Hashing::parse_dynamic_state_info
              ((DynamicStateInfo *)&global_info.multisample_state,pipe->pDynamicState);
    memcpy(local_110,&global_info.multisample_state,0x40);
  }
  GVar5 = Hashing::parse_global_state_info(pipe,(DynamicStateInfo *)local_110,subpass_meta);
  tess.data_.s.str = (Ch *)GVar5._0_8_;
  global_info._0_2_ = GVar5._8_2_;
  global_info.viewport_state = GVar5.module_state;
  if (((undefined1  [11])GVar5 & (undefined1  [11])0x100) != (undefined1  [11])0x0) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_180,kObjectType);
    rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_190,(char (*) [6])"flags");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_180,&local_190,pipe->pTessellationState->flags,alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<19u>
              (&local_1a0,(char (*) [19])"patchControlPoints");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_180,&local_1a0,pipe->pTessellationState->patchControlPoints,alloc);
    bVar2 = pnext_chain_add_json_value<VkPipelineTessellationStateCreateInfo,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      ((Value *)local_180,pipe->pTessellationState,alloc,
                       (DynamicStateInfo *)local_110);
    if (bVar2) {
      rapidjson::GenericStringRef<char>::GenericStringRef<18u>
                ((GenericStringRef<char> *)((long)&dyn.data_ + 8),(char (*) [18])"tessellationState"
                );
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_40,(StringRefType *)((long)&dyn.data_ + 8),
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_180,alloc);
    }
    else {
      pipe_local._7_1_ = 0;
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_180);
    if (!bVar2) goto LAB_0014d235;
  }
  if (pipe->pDynamicState != (VkPipelineDynamicStateCreateInfo *)0x0) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_1c8);
    bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      (pipe->pDynamicState,alloc,(Value *)local_1c8);
    if (bVar2) {
      rapidjson::GenericStringRef<char>::GenericStringRef<13u>
                ((GenericStringRef<char> *)((long)&ms.data_ + 8),(char (*) [13])"dynamicState");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_40,(StringRefType *)((long)&ms.data_ + 8),
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_1c8,alloc);
    }
    else {
      pipe_local._7_1_ = 0;
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_1c8);
    if (!bVar2) goto LAB_0014d235;
  }
  if (((undefined1  [11])GVar5 & (undefined1  [11])0x1000000) != (undefined1  [11])0x0) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_1e8,kObjectType);
    rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_1f8,(char (*) [6])"flags");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_1e8,&local_1f8,pipe->pMultisampleState->flags,alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<21u>
              (&local_208,(char (*) [21])"rasterizationSamples");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<VkSampleCountFlagBits>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_1e8,&local_208,pipe->pMultisampleState->rasterizationSamples,alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<20u>
              (&local_218,(char (*) [20])"sampleShadingEnable");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_1e8,&local_218,pipe->pMultisampleState->sampleShadingEnable,alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<17u>
              (&local_228,(char (*) [17])"minSampleShading");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<float>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)local_1e8,&local_228,pipe->pMultisampleState->minSampleShading,alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<17u>
              (&local_238,(char (*) [17])"alphaToOneEnable");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_1e8,&local_238,pipe->pMultisampleState->alphaToOneEnable,alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<22u>
              ((GenericStringRef<char> *)((long)&sm.data_ + 8),
               (char (*) [22])"alphaToCoverageEnable");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_1e8,(StringRefType *)((long)&sm.data_ + 8),
               pipe->pMultisampleState->alphaToCoverageEnable,alloc);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&i,kArrayType);
    if (pipe->pMultisampleState->pSampleMask != (VkSampleMask *)0x0) {
      local_25c = pipe->pMultisampleState->rasterizationSamples +
                  (VK_SAMPLE_COUNT_16_BIT|VK_SAMPLE_COUNT_8_BIT|VK_SAMPLE_COUNT_4_BIT|
                   VK_SAMPLE_COUNT_2_BIT|VK_SAMPLE_COUNT_1_BIT) >> 5;
      for (local_260 = 0; local_260 < local_25c; local_260 = local_260 + 1) {
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack<unsigned_int>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&i,pipe->pMultisampleState->pSampleMask[local_260],alloc);
      }
      rapidjson::GenericStringRef<char>::GenericStringRef<11u>
                (&local_270,(char (*) [11])"sampleMask");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_1e8,&local_270,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&i,alloc);
    }
    bVar2 = pnext_chain_add_json_value<VkPipelineMultisampleStateCreateInfo,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      ((Value *)local_1e8,pipe->pMultisampleState,alloc,
                       (DynamicStateInfo *)local_110);
    if (bVar2) {
      rapidjson::GenericStringRef<char>::GenericStringRef<17u>
                ((GenericStringRef<char> *)((long)&vi.data_ + 8),(char (*) [17])"multisampleState");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_40,(StringRefType *)((long)&vi.data_ + 8),
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_1e8,alloc);
    }
    else {
      pipe_local._7_1_ = 0;
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&i);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_1e8);
    if (!bVar2) goto LAB_0014d235;
  }
  if (((undefined1  [11])GVar5 & (undefined1  [11])0x1000000000000) != (undefined1  [11])0x0) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)((long)&attribs.data_ + 8),kObjectType);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)((long)&bindings.data_ + 8),kArrayType);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_2b0,kArrayType);
    rapidjson::GenericStringRef<char>::GenericStringRef<6u>
              ((GenericStringRef<char> *)local_2c0,(char (*) [6])"flags");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)((long)&attribs.data_ + 8),(StringRefType *)local_2c0,
               pipe->pVertexInputState->flags,alloc);
    for (a._4_4_ = 0; a._4_4_ < pipe->pVertexInputState->vertexAttributeDescriptionCount;
        a._4_4_ = a._4_4_ + 1) {
      attrib.data_.a.elements =
           (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *)(pipe->pVertexInputState->pVertexAttributeDescriptions + a._4_4_);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)local_2e0,kObjectType);
      rapidjson::GenericStringRef<char>::GenericStringRef<9u>(&local_2f0,(char (*) [9])"location");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_2e0,&local_2f0,*(uint *)attrib.data_.s.str,alloc);
      rapidjson::GenericStringRef<char>::GenericStringRef<8u>(&local_300,(char (*) [8])"binding");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_2e0,&local_300,((attrib.data_.o.members)->name).data_.s.hashcode,alloc);
      rapidjson::GenericStringRef<char>::GenericStringRef<7u>(&local_310,(char (*) [7])"offset");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_2e0,&local_310,
                 *(uint *)((long)&((attrib.data_.o.members)->name).data_ + 0xc),alloc);
      rapidjson::GenericStringRef<char>::GenericStringRef<7u>
                ((GenericStringRef<char> *)local_320,(char (*) [7])"format");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkFormat>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_2e0,(StringRefType *)local_320,
                 *(VkFormat *)((long)&((attrib.data_.o.members)->name).data_ + 8),alloc);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)((long)&bindings.data_ + 8),
                 (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_2e0,alloc);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_2e0);
    }
    for (b._4_4_ = 0; b._4_4_ < pipe->pVertexInputState->vertexBindingDescriptionCount;
        b._4_4_ = b._4_4_ + 1) {
      binding.data_.s.str = (Ch *)(pipe->pVertexInputState->pVertexBindingDescriptions + b._4_4_);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)local_340,kObjectType);
      rapidjson::GenericStringRef<char>::GenericStringRef<8u>(&local_350,(char (*) [8])"binding");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_340,&local_350,*(uint *)binding.data_.s.str,alloc);
      rapidjson::GenericStringRef<char>::GenericStringRef<7u>(&local_360,(char (*) [7])"stride");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_340,&local_360,((binding.data_.o.members)->name).data_.s.hashcode,alloc);
      rapidjson::GenericStringRef<char>::GenericStringRef<10u>
                (&local_370,(char (*) [10])"inputRate");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkVertexInputRate>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_340,&local_370,
                 *(VkVertexInputRate *)((long)&((binding.data_.o.members)->name).data_ + 8),alloc);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_2b0,
                 (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_340,alloc);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_340);
    }
    rapidjson::GenericStringRef<char>::GenericStringRef<11u>(&local_380,(char (*) [11])"attributes")
    ;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)((long)&attribs.data_ + 8),&local_380,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)((long)&bindings.data_ + 8),alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<9u>(&local_390,(char (*) [9])"bindings");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)((long)&attribs.data_ + 8),&local_390,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_2b0,alloc);
    bVar2 = pnext_chain_add_json_value<VkPipelineVertexInputStateCreateInfo,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      ((Value *)((long)&attribs.data_ + 8),pipe->pVertexInputState,alloc,
                       (DynamicStateInfo *)local_110);
    if (bVar2) {
      rapidjson::GenericStringRef<char>::GenericStringRef<17u>
                ((GenericStringRef<char> *)((long)&rs.data_ + 8),(char (*) [17])"vertexInputState");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_40,(StringRefType *)((long)&rs.data_ + 8),
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)((long)&attribs.data_ + 8),alloc);
    }
    else {
      pipe_local._7_1_ = 0;
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_2b0);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)((long)&bindings.data_ + 8));
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)((long)&attribs.data_ + 8));
    if (!bVar2) goto LAB_0014d235;
  }
  if (((undefined1  [11])GVar5 & (undefined1  [11])0x100000000000000) != (undefined1  [11])0x0) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_3b0,kObjectType);
    rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_3c0,(char (*) [6])"flags");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_3b0,&local_3c0,pipe->pRasterizationState->flags,alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<24u>
              (&local_3d0,(char (*) [24])"depthBiasConstantFactor");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<float>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)local_3b0,&local_3d0,pipe->pRasterizationState->depthBiasConstantFactor,
                     alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<21u>
              (&local_3e0,(char (*) [21])"depthBiasSlopeFactor");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<float>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)local_3b0,&local_3e0,pipe->pRasterizationState->depthBiasSlopeFactor,alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<15u>
              (&local_3f0,(char (*) [15])"depthBiasClamp");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<float>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)local_3b0,&local_3f0,pipe->pRasterizationState->depthBiasClamp,alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<16u>
              (&local_400,(char (*) [16])"depthBiasEnable");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_3b0,&local_400,pipe->pRasterizationState->depthBiasEnable,alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<17u>
              (&local_410,(char (*) [17])"depthClampEnable");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_3b0,&local_410,pipe->pRasterizationState->depthClampEnable,alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<12u>
              (&local_420,(char (*) [12])"polygonMode");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<VkPolygonMode>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_3b0,&local_420,pipe->pRasterizationState->polygonMode,alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<24u>
              (&local_430,(char (*) [24])"rasterizerDiscardEnable");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_3b0,&local_430,pipe->pRasterizationState->rasterizerDiscardEnable,alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<10u>(&local_440,(char (*) [10])"frontFace");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<VkFrontFace>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_3b0,&local_440,pipe->pRasterizationState->frontFace,alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<10u>(&local_450,(char (*) [10])"lineWidth");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<float>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)local_3b0,&local_450,pipe->pRasterizationState->lineWidth,alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<9u>(&local_460,(char (*) [9])"cullMode");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_3b0,&local_460,pipe->pRasterizationState->cullMode,alloc);
    bVar2 = pnext_chain_add_json_value<VkPipelineRasterizationStateCreateInfo,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      ((Value *)local_3b0,pipe->pRasterizationState,alloc,
                       (DynamicStateInfo *)local_110);
    if (bVar2) {
      rapidjson::GenericStringRef<char>::GenericStringRef<19u>
                ((GenericStringRef<char> *)((long)&ia.data_ + 8),(char (*) [19])"rasterizationState"
                );
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_40,(StringRefType *)((long)&ia.data_ + 8),
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_3b0,alloc);
    }
    else {
      pipe_local._7_1_ = 0;
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_3b0);
    if (!bVar2) goto LAB_0014d235;
  }
  if (((undefined1  [11])GVar5 & (undefined1  [11])0x1) != (undefined1  [11])0x0) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_480,kObjectType);
    rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_490,(char (*) [6])"flags");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_480,&local_490,pipe->pInputAssemblyState->flags,alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<9u>(&local_4a0,(char (*) [9])"topology");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<VkPrimitiveTopology>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_480,&local_4a0,pipe->pInputAssemblyState->topology,alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<23u>
              (&local_4b0,(char (*) [23])"primitiveRestartEnable");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_480,&local_4b0,pipe->pInputAssemblyState->primitiveRestartEnable,alloc);
    bVar2 = pnext_chain_add_json_value<VkPipelineInputAssemblyStateCreateInfo,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      ((Value *)local_480,pipe->pInputAssemblyState,alloc,
                       (DynamicStateInfo *)local_110);
    if (bVar2) {
      rapidjson::GenericStringRef<char>::GenericStringRef<19u>
                ((GenericStringRef<char> *)((long)&cb.data_ + 8),(char (*) [19])"inputAssemblyState"
                );
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_40,(StringRefType *)((long)&cb.data_ + 8),
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_480,alloc);
    }
    else {
      pipe_local._7_1_ = 0;
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_480);
    if (!bVar2) goto LAB_0014d235;
  }
  if (((undefined1  [11])GVar5 & (undefined1  [11])0x10000000000) != (undefined1  [11])0x0) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_4d0,kObjectType);
    rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_4e0,(char (*) [6])"flags");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_4d0,&local_4e0,pipe->pColorBlendState->flags,alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<8u>(&local_4f0,(char (*) [8])"logicOp");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<VkLogicOp>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_4d0,&local_4f0,pipe->pColorBlendState->logicOp,alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<14u>
              ((GenericStringRef<char> *)&i_3,(char (*) [14])"logicOpEnable");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_4d0,(StringRefType *)&i_3,pipe->pColorBlendState->logicOpEnable,alloc);
    bVar2 = false;
    local_8a9 = 0;
    if (((dynamic_info.tessellation_domain_origin & 1U) != 0) &&
       (local_8a9 = 0, (dynamic_info.polygon_mode & 1U) != 0)) {
      local_8a9 = dynamic_info.depth_clamp_enable;
    }
    if ((local_8a9 & 1) == 0) {
      for (a_1._0_4_ = 0; (uint)a_1 < pipe->pColorBlendState->attachmentCount;
          a_1._0_4_ = (uint)a_1 + 1) {
        pVVar4 = pipe->pColorBlendState->pAttachments + (uint)a_1;
        if ((pVVar4->blendEnable != 0) &&
           (((((pVVar4->dstAlphaBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA ||
               (pVVar4->dstAlphaBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR)) ||
              (pVVar4->srcAlphaBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA)) ||
             ((pVVar4->srcAlphaBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR ||
              (pVVar4->dstColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA)))) ||
            ((pVVar4->dstColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR ||
             ((pVVar4->srcColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA ||
              (pVVar4->srcColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR)))))))) {
          bVar2 = true;
        }
      }
    }
    else {
      bVar2 = true;
    }
    memset((void *)((long)&blend_constants.data_ + 8),0,0x20);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&__range3,kArrayType);
    pVVar1 = pipe->pColorBlendState;
    for (__end3 = pVVar1->blendConstants;
        (VkPipelineColorBlendStateCreateInfo *)__end3 != pVVar1 + 1; __end3 = __end3 + 1) {
      if (((local_110[6] & 1U) == 0) && (bVar2)) {
        local_8b0 = *__end3;
      }
      else {
        local_8b0 = 0.0;
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack<float>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&__range3,local_8b0,alloc);
    }
    rapidjson::GenericStringRef<char>::GenericStringRef<15u>
              ((GenericStringRef<char> *)((long)&attachments.data_ + 8),
               (char (*) [15])"blendConstants");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_4d0,(StringRefType *)((long)&attachments.data_ + 8),
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&__range3,alloc);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_580,kArrayType);
    for (a_2._4_4_ = 0; a_2._4_4_ < pipe->pColorBlendState->attachmentCount;
        a_2._4_4_ = a_2._4_4_ + 1) {
      if ((local_8a9 & 1) == 0) {
        local_8b8 = pipe->pColorBlendState->pAttachments + a_2._4_4_;
      }
      else {
        local_8b8 = (VkPipelineColorBlendAttachmentState *)((long)&blend_constants.data_ + 8);
      }
      att.data_.s.str = (Ch *)local_8b8;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)local_5a0,kObjectType);
      rapidjson::GenericStringRef<char>::GenericStringRef<20u>
                (&local_5b0,(char (*) [20])"dstAlphaBlendFactor");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkBlendFactor>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_5a0,&local_5b0,((att.data_.o.members)->value).data_.s.hashcode,alloc);
      rapidjson::GenericStringRef<char>::GenericStringRef<20u>
                (&local_5c0,(char (*) [20])"srcAlphaBlendFactor");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkBlendFactor>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_5a0,&local_5c0,((att.data_.o.members)->value).data_.s.length,alloc);
      rapidjson::GenericStringRef<char>::GenericStringRef<20u>
                (&local_5d0,(char (*) [20])"dstColorBlendFactor");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkBlendFactor>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_5a0,&local_5d0,
                 *(VkBlendFactor *)((long)&((att.data_.o.members)->name).data_ + 8),alloc);
      rapidjson::GenericStringRef<char>::GenericStringRef<20u>
                (&local_5e0,(char (*) [20])"srcColorBlendFactor");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkBlendFactor>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_5a0,&local_5e0,((att.data_.o.members)->name).data_.s.hashcode,alloc);
      rapidjson::GenericStringRef<char>::GenericStringRef<15u>
                (&local_5f0,(char (*) [15])"colorWriteMask");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_5a0,&local_5f0,
                 *(uint *)((long)&((att.data_.o.members)->value).data_ + 0xc),alloc);
      rapidjson::GenericStringRef<char>::GenericStringRef<13u>
                (&local_600,(char (*) [13])"alphaBlendOp");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkBlendOp>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_5a0,&local_600,
                 *(VkBlendOp *)((long)&((att.data_.o.members)->value).data_ + 8),alloc);
      rapidjson::GenericStringRef<char>::GenericStringRef<13u>
                (&local_610,(char (*) [13])"colorBlendOp");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkBlendOp>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_5a0,&local_610,
                 *(VkBlendOp *)((long)&((att.data_.o.members)->name).data_ + 0xc),alloc);
      rapidjson::GenericStringRef<char>::GenericStringRef<12u>
                (&local_620,(char (*) [12])"blendEnable");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_5a0,&local_620,*(uint *)att.data_.s.str,alloc);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_580,
                 (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_5a0,alloc);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_5a0);
    }
    rapidjson::GenericStringRef<char>::GenericStringRef<12u>
              (&local_630,(char (*) [12])"attachments");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_4d0,&local_630,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_580,alloc);
    bVar2 = pnext_chain_add_json_value<VkPipelineColorBlendStateCreateInfo,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      ((Value *)local_4d0,pipe->pColorBlendState,alloc,(DynamicStateInfo *)local_110
                      );
    if (bVar2) {
      rapidjson::GenericStringRef<char>::GenericStringRef<16u>
                ((GenericStringRef<char> *)((long)&vp.data_ + 8),(char (*) [16])"colorBlendState");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_40,(StringRefType *)((long)&vp.data_ + 8),
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_4d0,alloc);
    }
    else {
      pipe_local._7_1_ = 0;
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_580);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&__range3);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_4d0);
    if (!bVar2) goto LAB_0014d235;
  }
  if (((undefined1  [11])GVar5 & (undefined1  [11])0x10000) != (undefined1  [11])0x0) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_650,kObjectType);
    rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_660,(char (*) [6])"flags");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_650,&local_660,pipe->pViewportState->flags,alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<14u>
              (&local_670,(char (*) [14])"viewportCount");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_650,&local_670,pipe->pViewportState->viewportCount,alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<13u>
              ((GenericStringRef<char> *)((long)&viewports.data_ + 8),(char (*) [13])"scissorCount")
    ;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_650,(StringRefType *)((long)&viewports.data_ + 8),
               pipe->pViewportState->scissorCount,alloc);
    if (pipe->pViewportState->pViewports != (VkViewport *)0x0) {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)local_690,kArrayType);
      for (viewport.data_._12_4_ = 0;
          (uint)viewport.data_._12_4_ < pipe->pViewportState->viewportCount;
          viewport.data_._12_4_ = viewport.data_._12_4_ + 1) {
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)local_6a8,kObjectType);
        rapidjson::GenericStringRef<char>::GenericStringRef<2u>(&local_6b8,(char (*) [2])0x1e6cf9);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<float>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)local_6a8,&local_6b8,
                           pipe->pViewportState->pViewports[(uint)viewport.data_._12_4_].x,alloc);
        rapidjson::GenericStringRef<char>::GenericStringRef<2u>(&local_6c8,(char (*) [2])0x1e04e1);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<float>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)local_6a8,&local_6c8,
                           pipe->pViewportState->pViewports[(uint)viewport.data_._12_4_].y,alloc);
        rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_6d8,(char (*) [6])"width");
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<float>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)local_6a8,&local_6d8,
                           pipe->pViewportState->pViewports[(uint)viewport.data_._12_4_].width,alloc
                          );
        rapidjson::GenericStringRef<char>::GenericStringRef<7u>(&local_6e8,(char (*) [7])"height");
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<float>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)local_6a8,&local_6e8,
                           pipe->pViewportState->pViewports[(uint)viewport.data_._12_4_].height,
                           alloc);
        rapidjson::GenericStringRef<char>::GenericStringRef<9u>(&local_6f8,(char (*) [9])"minDepth")
        ;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<float>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)local_6a8,&local_6f8,
                           pipe->pViewportState->pViewports[(uint)viewport.data_._12_4_].minDepth,
                           alloc);
        rapidjson::GenericStringRef<char>::GenericStringRef<9u>(&local_708,(char (*) [9])"maxDepth")
        ;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<float>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)local_6a8,&local_708,
                           pipe->pViewportState->pViewports[(uint)viewport.data_._12_4_].maxDepth,
                           alloc);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_690,
                   (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_6a8,alloc);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)local_6a8);
      }
      rapidjson::GenericStringRef<char>::GenericStringRef<10u>
                ((GenericStringRef<char> *)((long)&scissors.data_ + 8),(char (*) [10])"viewports");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_650,(StringRefType *)((long)&scissors.data_ + 8),
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_690,alloc);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_690);
    }
    if (pipe->pViewportState->pScissors != (VkRect2D *)0x0) {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)local_728,kArrayType);
      for (scissor.data_._12_4_ = 0; (uint)scissor.data_._12_4_ < pipe->pViewportState->scissorCount
          ; scissor.data_._12_4_ = scissor.data_._12_4_ + 1) {
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)local_740,kObjectType);
        rapidjson::GenericStringRef<char>::GenericStringRef<2u>(&local_750,(char (*) [2])0x1e6cf9);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<int>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)local_740,&local_750,
                         pipe->pViewportState->pScissors[(uint)scissor.data_._12_4_].offset.x,alloc)
        ;
        rapidjson::GenericStringRef<char>::GenericStringRef<2u>(&local_760,(char (*) [2])0x1e04e1);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<int>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)local_740,&local_760,
                         pipe->pViewportState->pScissors[(uint)scissor.data_._12_4_].offset.y,alloc)
        ;
        rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_770,(char (*) [6])"width");
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<unsigned_int>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_740,&local_770,
                   pipe->pViewportState->pScissors[(uint)scissor.data_._12_4_].extent.width,alloc);
        rapidjson::GenericStringRef<char>::GenericStringRef<7u>(&local_780,(char (*) [7])"height");
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<unsigned_int>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_740,&local_780,
                   pipe->pViewportState->pScissors[(uint)scissor.data_._12_4_].extent.height,alloc);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_728,
                   (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_740,alloc);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)local_740);
      }
      rapidjson::GenericStringRef<char>::GenericStringRef<9u>(&local_790,(char (*) [9])"scissors");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_650,&local_790,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_728,alloc);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_728);
    }
    bVar2 = pnext_chain_add_json_value<VkPipelineViewportStateCreateInfo,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      ((Value *)local_650,pipe->pViewportState,alloc,(DynamicStateInfo *)local_110);
    if (bVar2) {
      rapidjson::GenericStringRef<char>::GenericStringRef<14u>
                ((GenericStringRef<char> *)((long)&ds.data_ + 8),(char (*) [14])"viewportState");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_40,(StringRefType *)((long)&ds.data_ + 8),
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_650,alloc);
    }
    else {
      pipe_local._7_1_ = 0;
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_650);
    if (!bVar2) goto LAB_0014d235;
  }
  if (((undefined1  [11])GVar5 & (undefined1  [11])0x100000000) != (undefined1  [11])0x0) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_7b0,kObjectType);
    rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_7c0,(char (*) [6])"flags");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_7b0,&local_7c0,pipe->pDepthStencilState->flags,alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<18u>
              (&local_7d0,(char (*) [18])"stencilTestEnable");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_7b0,&local_7d0,pipe->pDepthStencilState->stencilTestEnable,alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<15u>
              (&local_7e0,(char (*) [15])"maxDepthBounds");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<float>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)local_7b0,&local_7e0,pipe->pDepthStencilState->maxDepthBounds,alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<15u>
              (&local_7f0,(char (*) [15])"minDepthBounds");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<float>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)local_7b0,&local_7f0,pipe->pDepthStencilState->minDepthBounds,alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<22u>
              (&local_800,(char (*) [22])"depthBoundsTestEnable");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_7b0,&local_800,pipe->pDepthStencilState->depthBoundsTestEnable,alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<17u>
              (&local_810,(char (*) [17])"depthWriteEnable");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_7b0,&local_810,pipe->pDepthStencilState->depthWriteEnable,alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<16u>
              (&local_820,(char (*) [16])"depthTestEnable");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_7b0,&local_820,pipe->pDepthStencilState->depthTestEnable,alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<15u>
              ((GenericStringRef<char> *)&serialize_stencil,(char (*) [15])"depthCompareOp");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<VkCompareOp>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_7b0,(StringRefType *)&serialize_stencil,
               pipe->pDepthStencilState->depthCompareOp,alloc);
    front.data_.o.members = (Member *)alloc;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)((long)&back.data_ + 8),kObjectType);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_858,kObjectType);
    json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::anon_class_8_1_a7a39255::
    operator()((anon_class_8_1_a7a39255 *)&front.data_.s.str,(Value *)((long)&back.data_ + 8),
               &pipe->pDepthStencilState->front);
    json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::anon_class_8_1_a7a39255::
    operator()((anon_class_8_1_a7a39255 *)&front.data_.s.str,(Value *)local_858,
               &pipe->pDepthStencilState->back);
    rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_868,(char (*) [6])"front");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_7b0,&local_868,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)((long)&back.data_ + 8),alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<5u>(&local_878,(char (*) [5])"back");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_7b0,&local_878,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_858,alloc);
    bVar2 = pnext_chain_add_json_value<VkPipelineDepthStencilStateCreateInfo,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      ((Value *)local_7b0,pipe->pDepthStencilState,alloc,
                       (DynamicStateInfo *)local_110);
    if (bVar2) {
      rapidjson::GenericStringRef<char>::GenericStringRef<18u>
                ((GenericStringRef<char> *)((long)&stages.data_ + 8),
                 (char (*) [18])"depthStencilState");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_40,(StringRefType *)((long)&stages.data_ + 8),
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_7b0,alloc);
    }
    else {
      pipe_local._7_1_ = 0;
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_858);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)((long)&back.data_ + 8));
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_7b0);
    if (!bVar2) goto LAB_0014d235;
  }
  if ((global_info.viewport_state & 1U) != 0) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_898);
    bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      (pipe->pStages,pipe->stageCount,alloc,(Value *)local_898);
    if (bVar2) {
      rapidjson::GenericStringRef<char>::GenericStringRef<7u>(&local_8a8,(char (*) [7])"stages");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_40,&local_8a8,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_898,alloc);
    }
    else {
      pipe_local._7_1_ = 0;
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_898);
    if (!bVar2) goto LAB_0014d235;
  }
  bVar2 = pnext_chain_add_json_value<VkGraphicsPipelineCreateInfo,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    ((Value *)local_40,pipe,alloc,(DynamicStateInfo *)local_110);
  if (bVar2) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    operator=(p.data_.a.elements,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_40);
    pipe_local._7_1_ = 1;
  }
  else {
    pipe_local._7_1_ = 0;
  }
LAB_0014d235:
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)local_40);
  return (bool)(pipe_local._7_1_ & 1);
}

Assistant:

static bool json_value(const VkGraphicsPipelineCreateInfo &pipe,
                       const StateRecorder::SubpassMeta &subpass_meta,
                       Allocator &alloc, Value *out_value)
{
	Value p(kObjectType);
	p.AddMember("flags", pipe.flags, alloc);
	p.AddMember("basePipelineHandle", uint64_string(api_object_cast<uint64_t>(pipe.basePipelineHandle), alloc), alloc);
	p.AddMember("basePipelineIndex", pipe.basePipelineIndex, alloc);
	p.AddMember("layout", uint64_string(api_object_cast<uint64_t>(pipe.layout), alloc), alloc);
	p.AddMember("renderPass", uint64_string(api_object_cast<uint64_t>(pipe.renderPass), alloc), alloc);
	p.AddMember("subpass", pipe.subpass, alloc);

	DynamicStateInfo dynamic_info = {};
	if (pipe.pDynamicState)
		dynamic_info = Hashing::parse_dynamic_state_info(*pipe.pDynamicState);
	GlobalStateInfo global_info = Hashing::parse_global_state_info(pipe, dynamic_info, subpass_meta);

	if (global_info.tessellation_state)
	{
		Value tess(kObjectType);
		tess.AddMember("flags", pipe.pTessellationState->flags, alloc);
		tess.AddMember("patchControlPoints", pipe.pTessellationState->patchControlPoints, alloc);
		if (!pnext_chain_add_json_value(tess, *pipe.pTessellationState, alloc, &dynamic_info))
			return false;
		p.AddMember("tessellationState", tess, alloc);
	}

	if (pipe.pDynamicState)
	{
		Value dyn;
		if (!json_value(*pipe.pDynamicState, alloc, &dyn))
			return false;
		p.AddMember("dynamicState", dyn, alloc);
	}

	if (global_info.multisample_state)
	{
		Value ms(kObjectType);
		ms.AddMember("flags", pipe.pMultisampleState->flags, alloc);
		ms.AddMember("rasterizationSamples", pipe.pMultisampleState->rasterizationSamples, alloc);
		ms.AddMember("sampleShadingEnable", pipe.pMultisampleState->sampleShadingEnable, alloc);
		ms.AddMember("minSampleShading", pipe.pMultisampleState->minSampleShading, alloc);
		ms.AddMember("alphaToOneEnable", pipe.pMultisampleState->alphaToOneEnable, alloc);
		ms.AddMember("alphaToCoverageEnable", pipe.pMultisampleState->alphaToCoverageEnable, alloc);

		Value sm(kArrayType);
		if (pipe.pMultisampleState->pSampleMask)
		{
			auto entries = uint32_t(pipe.pMultisampleState->rasterizationSamples + 31) / 32;
			for (uint32_t i = 0; i < entries; i++)
				sm.PushBack(pipe.pMultisampleState->pSampleMask[i], alloc);
			ms.AddMember("sampleMask", sm, alloc);
		}

		if (!pnext_chain_add_json_value(ms, *pipe.pMultisampleState, alloc, &dynamic_info))
			return false;
		p.AddMember("multisampleState", ms, alloc);
	}

	if (global_info.vertex_input)
	{
		Value vi(kObjectType);

		Value attribs(kArrayType);
		Value bindings(kArrayType);
		vi.AddMember("flags", pipe.pVertexInputState->flags, alloc);

		for (uint32_t i = 0; i < pipe.pVertexInputState->vertexAttributeDescriptionCount; i++)
		{
			auto &a = pipe.pVertexInputState->pVertexAttributeDescriptions[i];
			Value attrib(kObjectType);
			attrib.AddMember("location", a.location, alloc);
			attrib.AddMember("binding", a.binding, alloc);
			attrib.AddMember("offset", a.offset, alloc);
			attrib.AddMember("format", a.format, alloc);
			attribs.PushBack(attrib, alloc);
		}

		for (uint32_t i = 0; i < pipe.pVertexInputState->vertexBindingDescriptionCount; i++)
		{
			auto &b = pipe.pVertexInputState->pVertexBindingDescriptions[i];
			Value binding(kObjectType);
			binding.AddMember("binding", b.binding, alloc);
			binding.AddMember("stride", b.stride, alloc);
			binding.AddMember("inputRate", b.inputRate, alloc);
			bindings.PushBack(binding, alloc);
		}
		vi.AddMember("attributes", attribs, alloc);
		vi.AddMember("bindings", bindings, alloc);
		if (!pnext_chain_add_json_value(vi, *pipe.pVertexInputState, alloc, &dynamic_info))
			return false;
		p.AddMember("vertexInputState", vi, alloc);
	}

	if (global_info.rasterization_state)
	{
		Value rs(kObjectType);
		rs.AddMember("flags", pipe.pRasterizationState->flags, alloc);
		rs.AddMember("depthBiasConstantFactor", pipe.pRasterizationState->depthBiasConstantFactor, alloc);
		rs.AddMember("depthBiasSlopeFactor", pipe.pRasterizationState->depthBiasSlopeFactor, alloc);
		rs.AddMember("depthBiasClamp", pipe.pRasterizationState->depthBiasClamp, alloc);
		rs.AddMember("depthBiasEnable", pipe.pRasterizationState->depthBiasEnable, alloc);
		rs.AddMember("depthClampEnable", pipe.pRasterizationState->depthClampEnable, alloc);
		rs.AddMember("polygonMode", pipe.pRasterizationState->polygonMode, alloc);
		rs.AddMember("rasterizerDiscardEnable", pipe.pRasterizationState->rasterizerDiscardEnable, alloc);
		rs.AddMember("frontFace", pipe.pRasterizationState->frontFace, alloc);
		rs.AddMember("lineWidth", pipe.pRasterizationState->lineWidth, alloc);
		rs.AddMember("cullMode", pipe.pRasterizationState->cullMode, alloc);
		if (!pnext_chain_add_json_value(rs, *pipe.pRasterizationState, alloc, &dynamic_info))
			return false;
		p.AddMember("rasterizationState", rs, alloc);
	}

	if (global_info.input_assembly)
	{
		Value ia(kObjectType);
		ia.AddMember("flags", pipe.pInputAssemblyState->flags, alloc);
		ia.AddMember("topology", pipe.pInputAssemblyState->topology, alloc);
		ia.AddMember("primitiveRestartEnable", pipe.pInputAssemblyState->primitiveRestartEnable, alloc);
		if (!pnext_chain_add_json_value(ia, *pipe.pInputAssemblyState, alloc, &dynamic_info))
			return false;
		p.AddMember("inputAssemblyState", ia, alloc);
	}

	if (global_info.color_blend_state)
	{
		Value cb(kObjectType);
		cb.AddMember("flags", pipe.pColorBlendState->flags, alloc);
		cb.AddMember("logicOp", pipe.pColorBlendState->logicOp, alloc);
		cb.AddMember("logicOpEnable", pipe.pColorBlendState->logicOpEnable, alloc);

		bool need_blend_constants = false;
		// Special EDS3 rule. If all of these are set, we must ignore the pAttachments pointer.
		const bool dynamic_attachments = dynamic_info.color_blend_enable &&
		                                 dynamic_info.color_write_mask &&
		                                 dynamic_info.color_blend_equation;

		if (dynamic_attachments)
		{
			need_blend_constants = true;
		}
		else
		{
			for (uint32_t i = 0; i < pipe.pColorBlendState->attachmentCount; i++)
			{
				auto &a = pipe.pColorBlendState->pAttachments[i];

				if (a.blendEnable &&
				    (a.dstAlphaBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA ||
				     a.dstAlphaBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR ||
				     a.srcAlphaBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA ||
				     a.srcAlphaBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR ||
				     a.dstColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA ||
				     a.dstColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR ||
				     a.srcColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA ||
				     a.srcColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR))
				{
					need_blend_constants = true;
				}
			}
		}

		const VkPipelineColorBlendAttachmentState blank_attachment = {};

		Value blend_constants(kArrayType);
		for (auto &c : pipe.pColorBlendState->blendConstants)
			blend_constants.PushBack(dynamic_info.blend_constants || !need_blend_constants ? 0.0f : c, alloc);
		cb.AddMember("blendConstants", blend_constants, alloc);
		Value attachments(kArrayType);
		for (uint32_t i = 0; i < pipe.pColorBlendState->attachmentCount; i++)
		{
			// We cannot completely decouple pAttachments from attachmentCount.
			// Just serialize dummy entries.

			auto &a = dynamic_attachments ? blank_attachment : pipe.pColorBlendState->pAttachments[i];
			Value att(kObjectType);
			att.AddMember("dstAlphaBlendFactor", a.dstAlphaBlendFactor, alloc);
			att.AddMember("srcAlphaBlendFactor", a.srcAlphaBlendFactor, alloc);
			att.AddMember("dstColorBlendFactor", a.dstColorBlendFactor, alloc);
			att.AddMember("srcColorBlendFactor", a.srcColorBlendFactor, alloc);
			att.AddMember("colorWriteMask", a.colorWriteMask, alloc);
			att.AddMember("alphaBlendOp", a.alphaBlendOp, alloc);
			att.AddMember("colorBlendOp", a.colorBlendOp, alloc);
			att.AddMember("blendEnable", a.blendEnable, alloc);
			attachments.PushBack(att, alloc);
		}
		cb.AddMember("attachments", attachments, alloc);
		if (!pnext_chain_add_json_value(cb, *pipe.pColorBlendState, alloc, &dynamic_info))
			return false;
		p.AddMember("colorBlendState", cb, alloc);
	}

	if (global_info.viewport_state)
	{
		Value vp(kObjectType);
		vp.AddMember("flags", pipe.pViewportState->flags, alloc);
		vp.AddMember("viewportCount", pipe.pViewportState->viewportCount, alloc);
		vp.AddMember("scissorCount", pipe.pViewportState->scissorCount, alloc);
		if (pipe.pViewportState->pViewports)
		{
			Value viewports(kArrayType);
			for (uint32_t i = 0; i < pipe.pViewportState->viewportCount; i++)
			{
				Value viewport(kObjectType);
				viewport.AddMember("x", pipe.pViewportState->pViewports[i].x, alloc);
				viewport.AddMember("y", pipe.pViewportState->pViewports[i].y, alloc);
				viewport.AddMember("width", pipe.pViewportState->pViewports[i].width, alloc);
				viewport.AddMember("height", pipe.pViewportState->pViewports[i].height, alloc);
				viewport.AddMember("minDepth", pipe.pViewportState->pViewports[i].minDepth, alloc);
				viewport.AddMember("maxDepth", pipe.pViewportState->pViewports[i].maxDepth, alloc);
				viewports.PushBack(viewport, alloc);
			}
			vp.AddMember("viewports", viewports, alloc);
		}

		if (pipe.pViewportState->pScissors)
		{
			Value scissors(kArrayType);
			for (uint32_t i = 0; i < pipe.pViewportState->scissorCount; i++)
			{
				Value scissor(kObjectType);
				scissor.AddMember("x", pipe.pViewportState->pScissors[i].offset.x, alloc);
				scissor.AddMember("y", pipe.pViewportState->pScissors[i].offset.y, alloc);
				scissor.AddMember("width", pipe.pViewportState->pScissors[i].extent.width, alloc);
				scissor.AddMember("height", pipe.pViewportState->pScissors[i].extent.height, alloc);
				scissors.PushBack(scissor, alloc);
			}
			vp.AddMember("scissors", scissors, alloc);
		}
		if (!pnext_chain_add_json_value(vp, *pipe.pViewportState, alloc, &dynamic_info))
			return false;
		p.AddMember("viewportState", vp, alloc);
	}

	if (global_info.depth_stencil_state)
	{
		Value ds(kObjectType);
		ds.AddMember("flags", pipe.pDepthStencilState->flags, alloc);
		ds.AddMember("stencilTestEnable", pipe.pDepthStencilState->stencilTestEnable, alloc);
		ds.AddMember("maxDepthBounds", pipe.pDepthStencilState->maxDepthBounds, alloc);
		ds.AddMember("minDepthBounds", pipe.pDepthStencilState->minDepthBounds, alloc);
		ds.AddMember("depthBoundsTestEnable", pipe.pDepthStencilState->depthBoundsTestEnable, alloc);
		ds.AddMember("depthWriteEnable", pipe.pDepthStencilState->depthWriteEnable, alloc);
		ds.AddMember("depthTestEnable", pipe.pDepthStencilState->depthTestEnable, alloc);
		ds.AddMember("depthCompareOp", pipe.pDepthStencilState->depthCompareOp, alloc);

		const auto serialize_stencil = [&](Value &v, const VkStencilOpState &state) {
			v.AddMember("compareOp", state.compareOp, alloc);
			v.AddMember("writeMask", state.writeMask, alloc);
			v.AddMember("reference", state.reference, alloc);
			v.AddMember("compareMask", state.compareMask, alloc);
			v.AddMember("passOp", state.passOp, alloc);
			v.AddMember("failOp", state.failOp, alloc);
			v.AddMember("depthFailOp", state.depthFailOp, alloc);
		};
		Value front(kObjectType);
		Value back(kObjectType);
		serialize_stencil(front, pipe.pDepthStencilState->front);
		serialize_stencil(back, pipe.pDepthStencilState->back);
		ds.AddMember("front", front, alloc);
		ds.AddMember("back", back, alloc);
		if (!pnext_chain_add_json_value(ds, *pipe.pDepthStencilState, alloc, &dynamic_info))
			return false;
		p.AddMember("depthStencilState", ds, alloc);
	}

	if (global_info.module_state)
	{
		Value stages;
		if (!json_value(pipe.pStages, pipe.stageCount, alloc, &stages))
			return false;
		p.AddMember("stages", stages, alloc);
	}

	if (!pnext_chain_add_json_value(p, pipe, alloc, &dynamic_info))
		return false;

	*out_value = p;
	return true;
}